

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O2

bool __thiscall
iDynTree::SubModelDecomposition::splitModelAlongJoints
          (SubModelDecomposition *this,Model *model,Traversal *fullModelTraversal,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splitJoints)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer puVar2;
  unsigned_long uVar3;
  __type _Var4;
  uint uVar5;
  int iVar6;
  pointer pbVar7;
  JointIndex JVar8;
  ostream *poVar9;
  size_t __new_size;
  Link *this_00;
  LinkIndex LVar10;
  IJoint *pIVar11;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  Link *this_01;
  LinkIndex LVar13;
  ulong uVar14;
  pointer pbVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  string jointToParentName;
  unsigned_long local_70;
  string local_50;
  
  pbVar15 = (splitJoints->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (splitJoints->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (uVar14 = 0; uVar18 = (long)pbVar7 - (long)pbVar15 >> 5, uVar14 < uVar18; uVar14 = uVar14 + 1)
  {
    JVar8 = Model::getJointIndex(model,pbVar15 + uVar14);
    if (JVar8 == JOINT_INVALID_INDEX) {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "[ERROR] SubModelDecomposition::splitModelAlongJoints error : ");
      poVar9 = std::operator<<(poVar9," requested to split the model along joint ");
      poVar9 = std::operator<<(poVar9,(string *)
                                      ((splitJoints->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar14));
      pcVar16 = " but no joint with that is in the model. ";
LAB_001bc125:
      poVar9 = std::operator<<(poVar9,pcVar16);
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_001bc135;
    }
    lVar19 = 0;
    uVar17 = 0;
    while( true ) {
      pbVar15 = (splitJoints->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar7 = (splitJoints->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)pbVar7 - (long)pbVar15 >> 5) <= uVar17) break;
      if (uVar14 != uVar17) {
        _Var4 = std::operator==(pbVar15 + uVar14,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(pbVar15->_M_dataplus)._M_p + lVar19));
        if (_Var4) {
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "[ERROR] SubModelDecomposition::splitModelAlongJoints error : ");
          poVar9 = std::operator<<(poVar9," the joint ");
          poVar9 = std::operator<<(poVar9,(string *)
                                          ((splitJoints->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar14));
          poVar9 = std::operator<<(poVar9," is both the element ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9," and ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9," of the splitJoints list,");
          pcVar16 = " please check the list of joints.";
          goto LAB_001bc125;
        }
      }
      uVar17 = uVar17 + 1;
      lVar19 = lVar19 + 0x20;
    }
  }
  __new_size = Model::getNrOfLinks(model);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->link2subModelIndex,__new_size);
  setNrOfSubModels(this,((long)(splitJoints->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(splitJoints->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  uVar17 = 0;
  local_70 = 0;
  do {
    uVar5 = Traversal::getNrOfVisitedLinks(fullModelTraversal);
    if (uVar5 <= uVar17) {
LAB_001bc135:
      return uVar18 <= uVar14;
    }
    this_00 = Traversal::getLink(fullModelTraversal,uVar17);
    LVar10 = Link::getIndex(this_00);
    if (uVar17 == 0) {
LAB_001bc21d:
      (this->link2subModelIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[LVar10] = local_70;
      Traversal::reset((this->subModelTraversals).
                       super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_70],model);
      Traversal::addTraversalBase
                ((this->subModelTraversals).
                 super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_70],this_00);
      local_70 = local_70 + 1;
    }
    else {
      pIVar11 = Traversal::getParentJoint(fullModelTraversal,uVar17);
      iVar6 = (*pIVar11->_vptr_IJoint[0x14])(pIVar11);
      Model::getJointName_abi_cxx11_(&local_50,model,CONCAT44(extraout_var,iVar6));
      _Var12 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((splitJoints->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (splitJoints->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish,&local_50);
      pbVar1 = (splitJoints->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::~string((string *)&local_50);
      if (_Var12._M_current != pbVar1) goto LAB_001bc21d;
      this_01 = Traversal::getParentLink(fullModelTraversal,uVar17);
      pIVar11 = Traversal::getParentJoint(fullModelTraversal,uVar17);
      LVar13 = Link::getIndex(this_01);
      puVar2 = (this->link2subModelIndex).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar2[LVar13];
      puVar2[LVar10] = uVar3;
      Traversal::addTraversalElement
                ((this->subModelTraversals).
                 super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar3],this_00,pIVar11,this_01);
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

bool SubModelDecomposition::splitModelAlongJoints(const Model& model,
                                                  const Traversal& fullModelTraversal,
                                                  const std::vector< std::string >& splitJoints)
{
    // first we check that all the splitJoints are actually
    // joints of the model
    for(size_t jnt=0; jnt < splitJoints.size(); jnt++ )
    {
        if( model.getJointIndex(splitJoints[jnt]) == JOINT_INVALID_INDEX )
        {
            std::cerr << "[ERROR] SubModelDecomposition::splitModelAlongJoints error : "
                      << " requested to split the model along joint " << splitJoints[jnt]
                      << " but no joint with that is in the model. " << std::endl;
            return false;
        }

        // Check for duplicates (while it would be possible to handle duplicates,
        // duplicates are tipically associated with some error in the input parameters)
        // O(n^2) solution for checking the duplicates, it can be improved but this simple solution
        // should work fine for tipical uses cases
        for (size_t duplicateJnt=0; duplicateJnt < splitJoints.size(); duplicateJnt++ )
        {
            if (duplicateJnt != jnt && splitJoints[jnt] == splitJoints[duplicateJnt])
            {
                std::cerr << "[ERROR] SubModelDecomposition::splitModelAlongJoints error : "
                          << " the joint " << splitJoints[jnt] << " is both the element "
                          << jnt << " and " << duplicateJnt << " of the splitJoints list,"
                          << " please check the list of joints." << std::endl;
                return false;
            }
        }
    }

    // secondly we check for duplicates

    // The number of link in the decomposition is exactly
    // the number of links in the model
    this->link2subModelIndex.resize(model.getNrOfLinks());

    // we first need to resize the decomposition
    // the number of the submodels is exactly the number of the joints
    // aloing we are dividing the model, plus one
    this->setNrOfSubModels(splitJoints.size()+1);

    // we will assign links to the submodel using a
    // simple scheme: the base of the full tree traversal
    // is assinged to submodel 0. Then we visit the links
    // of the traversal, and we assign a link to the submodel
    // of its parent, unless it is connected to its parent
    // with a joint contained in splitJoints : in that case
    // the link is assigned to a new submodel, and it became
    // the base of the traversal of that submodel .
    size_t newSubModelIndexAvailableToUse = 0;

    for(size_t fullModelTraversalEl=0;
        fullModelTraversalEl < fullModelTraversal.getNrOfVisitedLinks();
        fullModelTraversalEl++)
    {
        LinkConstPtr visitedLink = fullModelTraversal.getLink(fullModelTraversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();

        // the link is assigned to a new subModel if
        // the visited link is the base or if it is connected
        // to its parent with a split joint
        bool isLinkBaseOfNewSubModel = false;
        bool isLinkBaseOfFullTreeTraversal = (fullModelTraversalEl == 0);

        if( isLinkBaseOfFullTreeTraversal )
        {
            isLinkBaseOfNewSubModel = true;
        }
        else
        {
            IJointConstPtr jointToParent = fullModelTraversal.getParentJoint(fullModelTraversalEl);
            std::string jointToParentName = model.getJointName(jointToParent->getIndex());

            bool isJointToParentASplitJoint =
                (std::find(splitJoints.begin(), splitJoints.end(), jointToParentName) != splitJoints.end());

            if( isJointToParentASplitJoint )
            {
                isLinkBaseOfNewSubModel = true;
            }

        }

        if( isLinkBaseOfNewSubModel )
        {
            this->link2subModelIndex[visitedLinkIndex] = newSubModelIndexAvailableToUse;
            this->subModelTraversals[newSubModelIndexAvailableToUse]->reset(model);
            this->subModelTraversals[newSubModelIndexAvailableToUse]->addTraversalBase(visitedLink);

            newSubModelIndexAvailableToUse++;
        }
        else
        {
            // In this case we know that the link has a parent,
            // otherwise it would be a base of the submodel traversal
            LinkConstPtr parentLink = fullModelTraversal.getParentLink(fullModelTraversalEl);
            IJointConstPtr jointToParent = fullModelTraversal.getParentJoint(fullModelTraversalEl);

            size_t subModelIndex = this->link2subModelIndex[visitedLinkIndex]
                                 = this->link2subModelIndex[parentLink->getIndex()];

            this->subModelTraversals[subModelIndex]->addTraversalElement(visitedLink,jointToParent,parentLink);
        }
    }

    return true;
}